

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O2

aom_codec_err_t
aom_get_num_layers_from_operating_point_idc
          (int operating_point_idc,uint *number_spatial_layers,uint *number_temporal_layers)

{
  uint uVar1;
  int j;
  uint uVar2;
  int iVar3;
  bool bVar4;
  
  if (number_temporal_layers != (uint *)0x0 && number_spatial_layers != (uint *)0x0) {
    if (operating_point_idc == 0) {
      *number_temporal_layers = 1;
      *number_spatial_layers = 1;
    }
    else {
      *number_spatial_layers = 0;
      *number_temporal_layers = 0;
      uVar1 = *number_spatial_layers;
      uVar2 = 0;
      iVar3 = 4;
      while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
        uVar1 = uVar1 + (((uint)operating_point_idc >> (uVar2 & 0x1f | 8) & 1) != 0);
        uVar2 = uVar2 + 1;
      }
      *number_spatial_layers = uVar1;
      uVar1 = *number_temporal_layers;
      for (uVar2 = 0; uVar2 != 8; uVar2 = uVar2 + 1) {
        uVar1 = uVar1 + (((uint)operating_point_idc >> (uVar2 & 0x1f) & 1) != 0);
      }
      *number_temporal_layers = uVar1;
    }
    return AOM_CODEC_OK;
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

aom_codec_err_t aom_get_num_layers_from_operating_point_idc(
    int operating_point_idc, unsigned int *number_spatial_layers,
    unsigned int *number_temporal_layers) {
  // derive number of spatial/temporal layers from operating_point_idc

  if (!number_spatial_layers || !number_temporal_layers)
    return AOM_CODEC_INVALID_PARAM;

  if (operating_point_idc == 0) {
    *number_temporal_layers = 1;
    *number_spatial_layers = 1;
  } else {
    *number_spatial_layers = 0;
    *number_temporal_layers = 0;
    for (int j = 0; j < MAX_NUM_SPATIAL_LAYERS; j++) {
      *number_spatial_layers +=
          (operating_point_idc >> (j + MAX_NUM_TEMPORAL_LAYERS)) & 0x1;
    }
    for (int j = 0; j < MAX_NUM_TEMPORAL_LAYERS; j++) {
      *number_temporal_layers += (operating_point_idc >> j) & 0x1;
    }
  }

  return AOM_CODEC_OK;
}